

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  undefined1 *puVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  FILE *input;
  char *first;
  FILE *local_58;
  dynbuf buf;
  
  if (inc == (CookieInfo *)0x0) {
    inc = (CookieInfo *)(*Curl_ccalloc)(1,0x210);
    if (inc == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
    inc->next_expiration = 0x7fffffffffffffff;
  }
  inc->newsession = newsession;
  input = _stdin;
  if (data == (Curl_easy *)0x0) goto LAB_0011d6d7;
  if ((file == (char *)0x0) || (*file == '\0')) {
LAB_0011d6c8:
    inc->running = false;
  }
  else {
    if ((*file == '-') && (file[1] == '\0')) {
      inc->running = false;
      if (input == (FILE *)0x0) goto LAB_0011d6cf;
      local_58 = (FILE *)0x0;
    }
    else {
      input = fopen64(file,"rb");
      if (input == (FILE *)0x0) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"WARNING: failed to open cookie file \"%s\"",file);
        }
        goto LAB_0011d6c8;
      }
      inc->running = false;
      local_58 = input;
    }
    Curl_dyn_init(&buf,5000);
    iVar3 = Curl_get_line(&buf,(FILE *)input);
    if (iVar3 != 0) {
      do {
        first = Curl_dyn_ptr(&buf);
        iVar3 = curl_strnequal(first,"Set-Cookie:",0xb);
        if (iVar3 != 0) {
          for (first = first + 0xb; (*first == ' ' || (*first == '\t')); first = first + 1) {
          }
        }
        Curl_cookie_add(data,inc,iVar3 != 0,true,first,(char *)0x0,(char *)0x0,true);
        iVar3 = Curl_get_line(&buf,(FILE *)input);
      } while (iVar3 != 0);
    }
    Curl_dyn_free(&buf);
    remove_expired(inc);
    if (local_58 != (FILE *)0x0) {
      fclose(local_58);
    }
  }
LAB_0011d6cf:
  puVar1 = &(data->state).field_0x745;
  *puVar1 = *puVar1 | 8;
LAB_0011d6d7:
  inc->running = true;
  return inc;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *handle = NULL;

  if(!inc) {
    /* we did not get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    /*
     * Initialize the next_expiration time to signal that we do not have enough
     * information yet.
     */
    c->next_expiration = CURL_OFF_T_MAX;
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->newsession = newsession; /* new session? */

  if(data) {
    FILE *fp = NULL;
    if(file && *file) {
      if(!strcmp(file, "-"))
        fp = stdin;
      else {
        fp = fopen(file, "rb");
        if(!fp)
          infof(data, "WARNING: failed to open cookie file \"%s\"", file);
        else
          handle = fp;
      }
    }

    c->running = FALSE; /* this is not running, this is init */
    if(fp) {
      struct dynbuf buf;
      Curl_dyn_init(&buf, MAX_COOKIE_LINE);
      while(Curl_get_line(&buf, fp)) {
        char *lineptr = Curl_dyn_ptr(&buf);
        bool headerline = FALSE;
        if(checkprefix("Set-Cookie:", lineptr)) {
          /* This is a cookie line, get it! */
          lineptr += 11;
          headerline = TRUE;
          while(*lineptr && ISBLANK(*lineptr))
            lineptr++;
        }

        Curl_cookie_add(data, c, headerline, TRUE, lineptr, NULL, NULL, TRUE);
      }
      Curl_dyn_free(&buf); /* free the line buffer */

      /*
       * Remove expired cookies from the hash. We must make sure to run this
       * after reading the file, and not on every cookie.
       */
      remove_expired(c);

      if(handle)
        fclose(handle);
    }
    data->state.cookie_engine = TRUE;
  }
  c->running = TRUE;          /* now, we are running */

  return c;
}